

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMTypeInfoImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMTypeInfoImpl::getStringProperty(DOMTypeInfoImpl *this)

{
  PSVIProperty in_ESI;
  
  getStringProperty((DOMTypeInfoImpl *)&this[-1].fNormalizedValue,in_ESI);
  return;
}

Assistant:

const XMLCh* DOMTypeInfoImpl::getStringProperty(PSVIProperty prop) const {
    switch(prop)
    {
    case PSVI_Type_Definition_Name:             return fTypeName;
    case PSVI_Type_Definition_Namespace:        return fTypeNamespace;
    case PSVI_Member_Type_Definition_Name:      return fMemberTypeName;
    case PSVI_Member_Type_Definition_Namespace: return fMemberTypeNamespace;
    case PSVI_Schema_Default:                   return fDefaultValue;
    case PSVI_Schema_Normalized_Value:          return fNormalizedValue;
    default:                                    assert(false); /* it's not a string property */
    }
    return 0;
}